

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall Graph::run_GreedyAlgorithm(Graph *this)

{
  double dVar1;
  bool bVar2;
  Node *a;
  Car *pCVar3;
  Node a_00;
  bool bVar4;
  uint uVar5;
  bool *pbVar6;
  ulong unaff_RBP;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double local_80;
  
  uVar5 = this->num_node;
  iVar8 = 0;
  if (1 < (int)uVar5) {
    iVar8 = 0;
    do {
      a = this->nodes;
      if (a[1].visited == true) {
        pbVar6 = &a[2].visited;
        uVar9 = 2;
        do {
          uVar7 = uVar9;
          if (uVar5 == uVar7) break;
          bVar2 = *pbVar6;
          pbVar6 = pbVar6 + 0x20;
          uVar9 = uVar7 + 1;
        } while (bVar2 != false);
        if (uVar5 <= uVar7) break;
      }
      pCVar3 = this->cars;
      if (pCVar3[iVar8].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_start ==
          pCVar3[iVar8].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        Car::add_node(pCVar3 + iVar8,a,this->distance_matrix);
        uVar5 = this->num_node;
      }
      if ((int)uVar5 < 2) {
LAB_00106c3f:
        iVar10 = iVar8 + 1;
        if (this->num_car <= iVar10) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Cannot solve this by Greedy algorithm.",0x26);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
          std::ostream::put('\b');
          std::ostream::flush();
          break;
        }
        if (this->cars[iVar8].now_idx != 0) {
          Car::add_node(this->cars + iVar8,this->nodes,this->distance_matrix);
        }
      }
      else {
        bVar2 = true;
        uVar9 = 1;
        lVar11 = 0;
        local_80 = 100000.0;
        do {
          if ((((&this->nodes[1].visited)[lVar11] == false) &&
              (bVar4 = Car::ok_capacity(this->cars + iVar8,
                                        *(Node *)((long)&this->nodes[1].x + lVar11)), bVar4)) &&
             (pbVar6 = &this->nodes[1].visited + lVar11, a_00._16_8_ = *(undefined8 *)pbVar6,
             a_00._0_16_ = *(undefined1 (*) [16])((long)&this->nodes[1].x + lVar11),
             a_00._24_8_ = *(undefined8 *)(pbVar6 + 8),
             bVar4 = Car::ok_time(this->cars + iVar8,a_00,this->distance_matrix), bVar4)) {
            dVar1 = this->distance_matrix[this->cars[iVar8].now_idx][uVar9];
            if (dVar1 < local_80) {
              unaff_RBP = uVar9;
            }
            unaff_RBP = unaff_RBP & 0xffffffff;
            uVar12 = SUB84(dVar1,0);
            uVar13 = (int)((ulong)dVar1 >> 0x20);
            if (local_80 <= dVar1) {
              uVar12 = SUB84(local_80,0);
              uVar13 = (int)((ulong)local_80 >> 0x20);
            }
            bVar2 = (bool)(bVar2 & local_80 <= dVar1);
            local_80 = (double)CONCAT44(uVar13,uVar12);
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0x20;
        } while ((long)uVar9 < (long)this->num_node);
        if (bVar2) goto LAB_00106c3f;
        Car::add_node(this->cars + iVar8,this->nodes + (int)unaff_RBP,this->distance_matrix);
        iVar10 = iVar8;
      }
      iVar8 = iVar10;
      uVar5 = this->num_node;
    } while (1 < (int)uVar5);
  }
  if (this->cars[iVar8].now_idx != 0) {
    Car::add_node(this->cars + iVar8,this->nodes,this->distance_matrix);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"algorithm done.",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  return;
}

Assistant:

void Graph::run_GreedyAlgorithm()
{
	int car_idx = 0;
	while(!is_all_visited()){
		int best_node_idx;
		double min_distance = 100000;
		bool is_return_depot = true;
		
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] is depot
		}

		for(int node_idx = 1; node_idx < num_node; node_idx++){
			if(!nodes[node_idx].visited){
				if(cars[car_idx].ok_capacity(nodes[node_idx])){
					if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
						double tmp_distance = distance_matrix[cars[car_idx].now_idx][node_idx];
						if(tmp_distance < min_distance){
							min_distance = tmp_distance;
							is_return_depot = false;
							best_node_idx = node_idx;
						}
					}
				}
			}
		}

		if(!is_return_depot){
			cars[car_idx].add_node(&nodes[best_node_idx], distance_matrix);
		}
		else{// if edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle
			}
			else{
				std::cout << "Cannot solve this by Greedy algorithm." << std::endl;
				break;// std::exit(0);
			}
			
		}
	}//while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
				cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
	std::cout << "algorithm done." << std::endl;
}